

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateMembers
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  bool bVar2;
  char *pcVar3;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  size_t sStackY_130;
  Options local_118;
  Options local_c8;
  Options local_78;
  
  vars = &this->variables_;
  text._M_str = 
  "@SuppressWarnings(\"serial\")\nprivate volatile java.lang.Object $name$_ = $default$;\n";
  text._M_len = 0x53;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  PrintExtraFieldInfo(vars,printer);
  bVar2 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar2) {
    pFVar1 = this->descriptor_;
    Options::Options(&local_78,&this->context_->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_78,false,false,false);
    Options::~Options(&local_78);
    text_00._M_str =
         "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $is_field_present_message$;\n}\n"
    ;
    text_00._M_len = 0x77;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_00);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  }
  pFVar1 = this->descriptor_;
  Options::Options(&local_c8,&this->context_->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,GETTER,&local_c8,false,false,false);
  Options::~Options(&local_c8);
  text_01._M_str =
       "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  java.lang.Object ref = $name$_;\n  if (ref instanceof java.lang.String) {\n    return (java.lang.String) ref;\n  } else {\n    com.google.protobuf.ByteString bs = \n        (com.google.protobuf.ByteString) ref;\n    java.lang.String s = bs.toStringUtf8();\n"
  ;
  text_01._M_len = 0x155;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  bVar2 = CheckUtf8(this->descriptor_);
  if (bVar2) {
    pcVar3 = "    $name$_ = s;\n";
    sStackY_130 = 0x11;
  }
  else {
    pcVar3 = "    if (bs.isValidUtf8()) {\n      $name$_ = s;\n    }\n";
    sStackY_130 = 0x35;
  }
  text_02._M_str = pcVar3;
  text_02._M_len = sStackY_130;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  text_03._M_str = "    return s;\n  }\n}\n";
  text_03._M_len = 0x14;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_03);
  pFVar1 = this->descriptor_;
  Options::Options(&local_118,&this->context_->options_);
  WriteFieldStringBytesAccessorDocComment(printer,pFVar1,GETTER,&local_118,false,false,false);
  Options::~Options(&local_118);
  text_04._M_str =
       "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  java.lang.Object ref = $name$_;\n  if (ref instanceof java.lang.String) {\n    com.google.protobuf.ByteString b = \n        com.google.protobuf.ByteString.copyFromUtf8(\n            (java.lang.String) ref);\n    $name$_ = b;\n    return b;\n  } else {\n    return (com.google.protobuf.ByteString) ref;\n  }\n}\n"
  ;
  text_04._M_len = 0x19e;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  begin_varname_01._M_str = "{";
  begin_varname_01._M_len = 1;
  end_varname_01._M_str = "}";
  end_varname_01._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_01,end_varname_01,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "@SuppressWarnings(\"serial\")\n"
                 "private volatile java.lang.Object $name$_ = $default$;\n");
  PrintExtraFieldInfo(variables_, printer);

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $is_field_present_message$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  java.lang.Object ref = $name$_;\n"
      "  if (ref instanceof java.lang.String) {\n"
      "    return (java.lang.String) ref;\n"
      "  } else {\n"
      "    com.google.protobuf.ByteString bs = \n"
      "        (com.google.protobuf.ByteString) ref;\n"
      "    java.lang.String s = bs.toStringUtf8();\n");
  printer->Annotate("{", "}", descriptor_);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "    $name$_ = s;\n");
  } else {
    printer->Print(variables_,
                   "    if (bs.isValidUtf8()) {\n"
                   "      $name$_ = s;\n"
                   "    }\n");
  }
  printer->Print(variables_,
                 "    return s;\n"
                 "  }\n"
                 "}\n");
  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  java.lang.Object ref = $name$_;\n"
                 "  if (ref instanceof java.lang.String) {\n"
                 "    com.google.protobuf.ByteString b = \n"
                 "        com.google.protobuf.ByteString.copyFromUtf8(\n"
                 "            (java.lang.String) ref);\n"
                 "    $name$_ = b;\n"
                 "    return b;\n"
                 "  } else {\n"
                 "    return (com.google.protobuf.ByteString) ref;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
}